

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

bool __thiscall ON_SubDHeap::GrowVertexEdgeArray(ON_SubDHeap *this,ON_SubDVertex *v,size_t capacity)

{
  ON_SubDEdgePtr *pOVar1;
  bool bVar2;
  ulong local_18;
  
  local_18 = capacity;
  if (v == (ON_SubDVertex *)0x0) {
    ON_SubDIncrementErrorCount();
    bVar2 = false;
  }
  else {
    if (capacity == 0) {
      local_18 = (ulong)v->m_edge_count + 1;
    }
    bVar2 = true;
    if (v->m_edge_capacity < local_18) {
      pOVar1 = (ON_SubDEdgePtr *)
               ResizeArray(this,(ulong)v->m_edge_count,(ulong)v->m_edge_capacity,&v->m_edges->m_ptr,
                           &local_18);
      if (pOVar1 == (ON_SubDEdgePtr *)0x0) {
        bVar2 = false;
        v->m_edge_count = 0;
        v->m_edge_capacity = 0;
        v->m_edges = (ON_SubDEdgePtr *)0x0;
        ON_SubDIncrementErrorCount();
      }
      else {
        v->m_edges = pOVar1;
        v->m_edge_capacity = (unsigned_short)local_18;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_SubDHeap::GrowVertexEdgeArray(
  ON_SubDVertex* v,
  size_t capacity
  )
{
  if ( nullptr == v)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == capacity )
    capacity = v->m_edge_count+1;
  if ( capacity <= v->m_edge_capacity)
    return true;
  ON__UINT_PTR* a = ResizeArray(v->m_edge_count,v->m_edge_capacity,(ON__UINT_PTR*)v->m_edges,&capacity);
  if ( nullptr == a )
  {
    v->m_edge_count = 0;
    v->m_edge_capacity = 0;
    v->m_edges = 0;
    return ON_SUBD_RETURN_ERROR(false);
  }
  v->m_edges = (ON_SubDEdgePtr*)a;
  v->m_edge_capacity = (unsigned short)capacity;
  return true;
}